

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav.c
# Opt level: O2

void fsnav_linal_mul_u(double *res,double *v,double *u,size_t m,size_t n)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  double *pdVar9;
  double *pdVar10;
  bool bVar11;
  double dVar12;
  
  uVar2 = m * n;
  uVar5 = uVar2 - 1;
  pdVar9 = v + uVar2;
  do {
    if (uVar2 <= uVar5) {
      return;
    }
    lVar6 = ((n + 1) * n >> 1) - 1;
    pdVar10 = pdVar9;
    for (uVar1 = 0; n != uVar1; uVar1 = uVar1 + 1) {
      lVar4 = uVar5 - uVar1;
      dVar12 = v[lVar4] * u[lVar6];
      res[lVar4] = dVar12;
      lVar7 = ~uVar1 + lVar6;
      lVar8 = -2;
      for (uVar3 = 1; uVar3 < n - uVar1; uVar3 = uVar3 + 1) {
        dVar12 = dVar12 + pdVar10[lVar8] * u[lVar7];
        res[lVar4] = dVar12;
        lVar7 = (lVar7 - uVar1) + lVar8;
        lVar8 = lVar8 + -1;
      }
      lVar6 = (lVar6 - uVar1) + -2;
      pdVar10 = pdVar10 + -1;
    }
    pdVar9 = pdVar9 + -n;
    bVar11 = n <= uVar5;
    uVar5 = uVar5 - n;
  } while (bVar11);
  return;
}

Assistant:

void fsnav_linal_mul_u(double* res, double* v, double* u, const size_t m, const size_t n)
{
	size_t 
		i, j, k, k0, r, r0, 
		nj, mn, nn1;

	mn = m*n;
	nn1 = n*(n+1)/2 - 1;
	for (r0 = mn-1; r0 < mn; r0 -= n) {
		for (j = 0, k0 = nn1; j < n; k0 -= j+2, j++) {
			r = r0 - j;
			nj = n - j;
			res[r] = v[r]*u[k0];
			for (i = 1, k = k0-j-1; i < nj; i++, k -= i+j)
				res[r] += v[r-i]*u[k];
		}
		if (r0 < n)
			break;
	}		
}